

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void __thiscall
OpenSteer::DrawSphereHelper::drawTriangleOnSphere(DrawSphereHelper *this,Vec3 *a,Vec3 *b,Vec3 *c)

{
  Vec3 *in_RDI;
  Vec3 VVar1;
  bool nearSilhouette;
  float t;
  float unitDot;
  bool seen;
  float dot;
  Vec3 view;
  Vec3 triNormal;
  Vec3 triCenter;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 uVar2;
  byte bVar3;
  Vec3 *in_stack_ffffffffffffff08;
  Vec3 *v;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar5;
  float local_e8;
  float fStack_e4;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Vec3 local_d8;
  float local_cc;
  byte local_c5;
  float local_c4;
  Vec3 local_c0;
  Vec3 local_ac;
  Vec3 local_a0;
  Vec3 local_90;
  Vec3 local_80;
  Vec3 local_70;
  Vec3 local_60;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  Vec3 local_30 [4];
  
  VVar1 = Vec3::operator+((Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
  local_60.z = VVar1.z;
  local_48 = local_60.z;
  local_60._0_8_ = VVar1._0_8_;
  local_50._0_4_ = local_60.x;
  local_50._4_4_ = local_60.y;
  local_60 = VVar1;
  VVar1 = Vec3::operator+((Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
  local_70.z = VVar1.z;
  local_38 = local_70.z;
  local_70._0_8_ = VVar1._0_8_;
  local_40._0_4_ = local_70.x;
  local_40._4_4_ = local_70.y;
  local_70 = VVar1;
  VVar1 = Vec3::operator/((Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (float)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  local_80.z = VVar1.z;
  local_30[0].z = local_80.z;
  local_80._0_8_ = VVar1._0_8_;
  local_30[0].x = local_80.x;
  local_30[0].y = local_80.y;
  v = local_30;
  local_80 = VVar1;
  VVar1 = Vec3::operator-((Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),v);
  local_a0.z = VVar1.z;
  local_90.z = local_a0.z;
  local_a0._0_8_ = VVar1._0_8_;
  local_90.x = local_a0.x;
  local_90.y = local_a0.y;
  local_a0 = VVar1;
  VVar1 = Vec3::operator-((Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),v);
  local_c0._0_8_ = VVar1._0_8_;
  local_ac.x = local_c0.x;
  local_ac.y = local_c0.y;
  local_c0.z = VVar1.z;
  local_ac.z = local_c0.z;
  local_c0 = VVar1;
  local_c4 = Vec3::dot(&local_ac,&local_90);
  if (local_c4 <= 0.0) {
    bVar3 = *(byte *)&in_RDI[3].y;
  }
  else {
    bVar3 = *(byte *)((long)&in_RDI[3].y + 1);
  }
  local_c5 = bVar3 & 1;
  if (local_c5 != 0) {
    if (((uint)in_RDI[1].z & 1) == 0) {
      VVar1 = Vec3::normalize((Vec3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
      ;
      _local_e8 = VVar1._0_8_;
      local_d8.z = VVar1.z;
      local_d8.x = local_e8;
      local_d8.y = fStack_e4;
      local_cc = Vec3::dot(&local_ac,&local_d8);
      uVar5 = 0x3d4ccccd;
      uVar2 = local_cc < 0.05 || -0.05 < local_cc;
      uVar4 = CONCAT13(uVar2,(int3)in_stack_ffffffffffffff10);
      if ((local_cc < 0.05 || -0.05 < local_cc) &&
         ((((uint)in_RDI[3].y & 0x100) == 0 || (((uint)in_RDI[3].y & 1) == 0)))) {
        drawLine(in_RDI,(Vec3 *)CONCAT17(bVar3,CONCAT16(uVar2,in_stack_fffffffffffffef8)),
                 (Color *)0x121aa4);
        drawLine(in_RDI,(Vec3 *)CONCAT17(bVar3,CONCAT16(uVar2,in_stack_fffffffffffffef8)),
                 (Color *)0x121ac2);
        drawLine(in_RDI,(Vec3 *)CONCAT17(bVar3,CONCAT16(uVar2,in_stack_fffffffffffffef8)),
                 (Color *)0x121ae0);
      }
      else {
        drawMeshedTriangleLine
                  ((DrawSphereHelper *)CONCAT44(0x3d4ccccd,uVar4),v,in_RDI,
                   (Color *)CONCAT17(bVar3,CONCAT16(uVar2,in_stack_fffffffffffffef8)));
        drawMeshedTriangleLine
                  ((DrawSphereHelper *)CONCAT44(uVar5,uVar4),v,in_RDI,
                   (Color *)CONCAT17(bVar3,CONCAT16(uVar2,in_stack_fffffffffffffef8)));
        drawMeshedTriangleLine
                  ((DrawSphereHelper *)CONCAT44(uVar5,uVar4),v,in_RDI,
                   (Color *)CONCAT17(bVar3,CONCAT16(uVar2,in_stack_fffffffffffffef8)));
      }
    }
    else if (((uint)in_RDI[3].y & 1) == 0) {
      drawTriangle((Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),v,in_RDI,
                   (Color *)CONCAT17(bVar3,CONCAT16(in_stack_fffffffffffffefe,
                                                    in_stack_fffffffffffffef8)));
    }
    else {
      drawTriangle((Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),v,in_RDI,
                   (Color *)CONCAT17(bVar3,CONCAT16(in_stack_fffffffffffffefe,
                                                    in_stack_fffffffffffffef8)));
    }
  }
  return;
}

Assistant:

void drawTriangleOnSphere (const Vec3& a, 
                                   const Vec3& b,
                                   const Vec3& c) const
        {
            // draw triangle, subject to the camera orientation criteria
            // (according to drawBackFacing and drawFrontFacing)
            const Vec3 triCenter = (a + b + c) / 3.0f;
            const Vec3 triNormal = triCenter - center; // not unit length
            const Vec3 view = triCenter - viewpoint;
            const float dot = view.dot (triNormal); // project normal on view
            const bool seen = ((dot>0.0f) ? drawBackFacing : drawFrontFacing);
            if (seen)
            {
                if (filled)
                {
                    // draw filled triangle
                    if (drawFrontFacing)
                        drawTriangle (c, b, a, color);
                    else
                        drawTriangle (a, b, c, color);
                }
                else
                {
                    // draw triangle edges (use trick to avoid drawing each
                    // edge twice (for each adjacent triangle) unless we are
                    // culling and this tri is near the sphere's silhouette)
                    const float unitDot = view.dot (triNormal.normalize ());
                    const float t = 0.05f; // near threshold
                    const bool nearSilhouette = (unitDot<t) || (unitDot>-t);
                    if (nearSilhouette && !(drawBackFacing&&drawFrontFacing))
                    {
                        drawLine (a, b, color);
                        drawLine (b, c, color);
                        drawLine (c, a, color);
                    }
                    else
                    {
                        drawMeshedTriangleLine (a, b, color);
                        drawMeshedTriangleLine (b, c, color);
                        drawMeshedTriangleLine (c, a, color);
                    }
                }
            }
        }